

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

int nifti_image_load_bricks(nifti_image *nim,int nbricks,int *blist,nifti_brick_list *NBL)

{
  size_t *psVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  znzFile fp_00;
  int iVar6;
  void *__ptr;
  void *__ptr_00;
  void **ppvVar7;
  void *pvVar8;
  long lVar9;
  size_t sVar10;
  ulong extraout_RAX;
  ulong uVar11;
  ulong uVar12;
  long offset;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  char *pcVar17;
  ulong uVar18;
  uint uVar19;
  size_t sVar20;
  znzFile fp;
  long local_48;
  znzFile local_40;
  long local_38;
  
  if ((nim == (nifti_image *)0x0) || (NBL == (nifti_brick_list *)0x0)) {
    fprintf(_stderr,"** nifti_image_load_bricks, bad params (%p,%p)\n",nim,NBL);
    return -1;
  }
  uVar12 = (ulong)(uint)nbricks;
  if (nbricks < 1 && blist != (int *)0x0) {
    if (g_opts_0 < 2) {
      blist = (int *)0x0;
    }
    else {
      blist = (int *)0x0;
      fprintf(_stderr,"-d load_bricks: received blist with nbricks = %d,ignoring blist\n",uVar12);
    }
  }
  if (blist == (int *)0x0) {
    __ptr = (void *)0x0;
    __ptr_00 = (void *)0x0;
  }
  else {
    iVar6 = valid_nifti_brick_list(nim,nbricks,blist,(uint)(0 < g_opts_0));
    if (iVar6 == 0) {
      return -1;
    }
    sVar20 = (long)nbricks << 2;
    __ptr = malloc(sVar20);
    __ptr_00 = malloc(sVar20);
    if ((__ptr == (void *)0x0) || (__ptr_00 == (void *)0x0)) {
      fprintf(_stderr,"** NCS: failed to alloc %d ints for sorting\n",uVar12);
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      if (__ptr_00 != (void *)0x0) {
        free(__ptr_00);
      }
    }
    else {
      memcpy(__ptr,blist,sVar20);
      if (0 < nbricks) {
        uVar11 = 0;
        do {
          *(int *)((long)__ptr_00 + uVar11 * 4) = (int)uVar11;
          uVar11 = uVar11 + 1;
        } while (uVar12 != uVar11);
      }
      uVar19 = nbricks - 1;
      if (1 < nbricks) {
        uVar11 = 1;
        uVar13 = 0;
        do {
          uVar18 = uVar13 & 0xffffffff;
          uVar14 = uVar11;
          do {
            uVar15 = (uint)uVar14;
            if (*(int *)((long)__ptr + (long)(int)(uint)uVar18 * 4) <=
                *(int *)((long)__ptr + uVar14 * 4)) {
              uVar15 = (uint)uVar18;
            }
            uVar14 = uVar14 + 1;
            uVar18 = (ulong)uVar15;
          } while (uVar12 != uVar14);
          if (uVar13 != uVar15) {
            uVar2 = *(undefined4 *)((long)__ptr + uVar13 * 4);
            lVar16 = (long)(int)uVar15;
            *(undefined4 *)((long)__ptr + uVar13 * 4) = *(undefined4 *)((long)__ptr + lVar16 * 4);
            *(undefined4 *)((long)__ptr + lVar16 * 4) = uVar2;
            uVar2 = *(undefined4 *)((long)__ptr_00 + uVar13 * 4);
            *(undefined4 *)((long)__ptr_00 + uVar13 * 4) =
                 *(undefined4 *)((long)__ptr_00 + lVar16 * 4);
            *(undefined4 *)((long)__ptr_00 + lVar16 * 4) = uVar2;
          }
          uVar13 = uVar13 + 1;
          uVar11 = uVar11 + 1;
        } while (uVar13 != uVar19);
      }
      if (2 < g_opts_0) {
        fwrite("+d sorted indexing list:\n",0x19,1,_stderr);
        fwrite("  orig   : ",0xb,1,_stderr);
        if (nbricks < 1) {
          nifti_image_load_bricks_cold_1();
LAB_001062e4:
          nifti_image_load_bricks_cold_3();
        }
        else {
          nifti_image_load_bricks_cold_2();
          if ((extraout_RAX & 1) != 0) goto LAB_001062e4;
        }
        fputc(10,_stderr);
      }
      uVar11 = 0;
      uVar12 = (ulong)uVar19;
      if ((int)uVar19 < 1) {
        uVar12 = uVar11;
      }
      do {
        if (uVar12 == uVar11) {
          bVar5 = true;
          if (2 < g_opts_0) {
            nifti_image_load_bricks_cold_5();
          }
          goto LAB_00105e66;
        }
        iVar6 = *(int *)((long)__ptr + uVar11 * 4);
      } while ((iVar6 <= *(int *)((long)__ptr + uVar11 * 4 + 4)) &&
              (lVar16 = uVar11 * 4, uVar11 = uVar11 + 1,
              blist[*(int *)((long)__ptr_00 + lVar16)] == iVar6));
      nifti_image_load_bricks_cold_4();
      __ptr = (void *)0x0;
      __ptr_00 = (void *)0x0;
    }
    bVar5 = false;
LAB_00105e66:
    if (!bVar5) {
      return -1;
    }
  }
  local_40 = nifti_image_load_prep(nim);
  if (local_40 == (znzFile)0x0) {
    if (0 < g_opts_0) {
      nifti_image_load_bricks_cold_11();
    }
    if (blist != (int *)0x0) {
      free(__ptr);
      free(__ptr_00);
      return -1;
    }
    return -1;
  }
  if (blist == (int *)0x0) {
    nbricks = 0;
  }
  if (nbricks < 1) {
    NBL->nbricks = 1;
    uVar19 = nim->ndim;
    if (3 < (int)uVar19) {
      iVar6 = 1;
      lVar16 = 0;
      do {
        iVar6 = iVar6 * nim->dim[lVar16 + 4];
        NBL->nbricks = iVar6;
        lVar16 = lVar16 + 1;
      } while ((ulong)uVar19 - 3 != lVar16);
    }
  }
  else {
    NBL->nbricks = nbricks;
  }
  sVar20 = (long)nim->nbyper * (long)nim->nz * (long)nim->ny * (long)nim->nx;
  NBL->bsize = sVar20;
  uVar19 = NBL->nbricks;
  ppvVar7 = (void **)malloc((long)(int)uVar19 * 8);
  NBL->bricks = ppvVar7;
  if (ppvVar7 == (void **)0x0) {
    fprintf(_stderr,"** NANM: failed to alloc %d void ptrs\n",(ulong)(uint)nbricks);
LAB_0010629f:
    if (blist != (int *)0x0) {
      free(__ptr);
      free(__ptr_00);
    }
    Xznzclose(&local_40);
    return -1;
  }
  psVar1 = &NBL->bsize;
  if (0 < (int)uVar19) {
    uVar12 = 0;
    do {
      pvVar8 = malloc(sVar20);
      NBL->bricks[uVar12] = pvVar8;
      if (NBL->bricks[uVar12] == (void *)0x0) {
        fprintf(_stderr,"** NANM: failed to alloc %u bytes for brick %d\n",sVar20 & 0xffffffff,
                uVar12 & 0xffffffff);
        if (uVar12 != 0) {
          lVar16 = uVar12 + 1;
          do {
            free(NBL->bricks[(int)lVar16 - 2]);
            lVar16 = lVar16 + -1;
          } while (1 < lVar16);
        }
        free(NBL->bricks);
        NBL->nbricks = 0;
        *psVar1 = 0;
        NBL->bricks = (void **)0x0;
        goto LAB_0010629f;
      }
      uVar12 = uVar12 + 1;
    } while ((long)(int)uVar19 != uVar12);
  }
  if (2 < g_opts_0) {
    fprintf(_stderr,"+d NANM: alloc\'d %d bricks of %u bytes for NBL\n",(ulong)uVar19,
            sVar20 & 0xffffffff);
  }
  fp_00 = local_40;
  local_48 = znztell(local_40);
  local_38 = local_48;
  if (local_48 < 0) {
    nifti_image_load_bricks_cold_10();
  }
  else {
    if (__ptr == (void *)0x0) {
      uVar12 = (ulong)(uint)NBL->nbricks;
      if (0 < NBL->nbricks) {
        lVar16 = 0;
        do {
          sVar10 = nifti_read_buffer(fp_00,NBL->bricks[lVar16],NBL->bsize,nim);
          if (sVar10 != NBL->bsize) {
            nifti_image_load_bricks_cold_9();
            goto LAB_00106346;
          }
          lVar16 = lVar16 + 1;
          uVar12 = (ulong)NBL->nbricks;
        } while (lVar16 < (long)uVar12);
      }
      if (1 < g_opts_0) {
        pcVar17 = nim->iname;
        if (pcVar17 == (char *)0x0) {
          pcVar17 = nim->fname;
        }
        fprintf(_stderr,"+d read %d default %u-byte bricks from file %s\n",uVar12,
                (ulong)(uint)*psVar1,pcVar17);
      }
      goto LAB_00106354;
    }
    if (__ptr_00 != (void *)0x0) {
      if (0 < NBL->nbricks) {
        lVar16 = 0;
        iVar6 = -1;
        do {
          iVar3 = *(int *)((long)__ptr + lVar16 * 4);
          iVar4 = *(int *)((long)__ptr_00 + lVar16 * 4);
          if (iVar3 == iVar6) {
            memcpy(NBL->bricks[iVar4],NBL->bricks[*(int *)((long)__ptr_00 + lVar16 * 4 + -4)],
                   NBL->bsize);
          }
          else {
            offset = (long)iVar3 * *psVar1 + local_38;
            if ((local_48 != offset) &&
               (lVar9 = znzseek(fp_00,offset,0), local_48 = offset, lVar9 < 0)) {
              nifti_image_load_bricks_cold_6();
              goto LAB_00106346;
            }
            sVar10 = nifti_read_buffer(fp_00,NBL->bricks[iVar4],NBL->bsize,nim);
            if (sVar10 != NBL->bsize) {
              nifti_image_load_bricks_cold_7();
              goto LAB_00106346;
            }
            local_48 = local_48 + NBL->bsize;
          }
          lVar16 = lVar16 + 1;
          iVar6 = iVar3;
        } while (lVar16 < NBL->nbricks);
      }
      goto LAB_00106354;
    }
    nifti_image_load_bricks_cold_8();
  }
LAB_00106346:
  nifti_free_NBL(NBL);
  NBL->nbricks = 0;
LAB_00106354:
  if (__ptr != (void *)0x0) {
    free(__ptr);
    free(__ptr_00);
  }
  Xznzclose(&local_40);
  return NBL->nbricks;
}

Assistant:

int nifti_image_load_bricks( nifti_image * nim , int nbricks,
                             const int * blist, nifti_brick_list * NBL )
{
   int     * slist = NULL, * sindex = NULL, rv;
   znzFile   fp;

   /* we can have blist == NULL */
   if( !nim || !NBL ){
      fprintf(stderr,"** nifti_image_load_bricks, bad params (%p,%p)\n",
              (void *)nim, (void *)NBL);
      return -1;
   }

   if( blist && nbricks <= 0 ){
      if( g_opts.debug > 1 )
         fprintf(stderr,"-d load_bricks: received blist with nbricks = %d,"
                        "ignoring blist\n", nbricks);
      blist = NULL; /* pretend nothing was passed */
   }

   if( blist && ! valid_nifti_brick_list(nim, nbricks, blist, g_opts.debug>0) )
      return -1;

   /* for efficiency, let's read the file in order */
   if( blist && nifti_copynsort( nbricks, blist, &slist, &sindex ) != 0 )
      return -1;

   /* open the file and position the FILE pointer */
   fp = nifti_image_load_prep( nim );
   if( !fp ){
      if( g_opts.debug > 0 )
         fprintf(stderr,"** nifti_image_load_bricks, failed load_prep\n");
      if( blist ){ free(slist); free(sindex); }
      return -1;
   }

   /* this will flag to allocate defaults */
   if( !blist ) nbricks = 0;
   if( nifti_alloc_NBL_mem( nim, nbricks, NBL ) != 0 ){
      if( blist ){ free(slist); free(sindex); }
      znzclose(fp);
      return -1;
   }

   rv = nifti_load_NBL_bricks(nim, slist, sindex, NBL, fp);

   if( rv != 0 ){
      nifti_free_NBL( NBL );  /* failure! */
      NBL->nbricks = 0; /* repetative, but clear */
   }

   if( slist ){ free(slist); free(sindex); }

   znzclose(fp);

   return NBL->nbricks;
}